

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedBrokerServer.cpp
# Opt level: O2

ActionMessage *
helics::apps::TypedBrokerServer::generateMessageResponse
          (ActionMessage *__return_storage_ptr__,ActionMessage *rxcmd,portData *pdata,CoreType ctype
          )

{
  action_t aVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char cVar5;
  string_view brokerName;
  string_view name;
  string_view brokerName_00;
  string_view configureString;
  string_view configureString_00;
  string_view str;
  shared_ptr<helics::Broker> brk;
  string brkinit;
  pair<std::shared_ptr<helics::Broker>,_bool> nbrk;
  string brkname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  __shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> local_a0;
  char local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string local_48;
  
  aVar1 = rxcmd->messageAction;
  if ((((aVar1 != cmd_protocol_priority) && (aVar1 != cmd_protocol_big)) && (aVar1 != cmd_protocol))
     || ((rxcmd->messageID != 0x5af && (rxcmd->messageID != 299)))) {
    ActionMessage::ActionMessage(__return_storage_ptr__,cmd_ignore);
    return __return_storage_ptr__;
  }
  iVar2 = getOpenPort(pdata);
  if (iVar2 < 1) {
    ActionMessage::ActionMessage(__return_storage_ptr__,cmd_protocol);
    __return_storage_ptr__->messageID = 0xed3;
    return __return_storage_ptr__;
  }
  local_88.first._M_dataplus._M_p = (pointer)&local_88.first.field_2;
  local_88.first._M_string_length = 0;
  local_88.first.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  pbVar3 = (rxcmd->stringData).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = pbVar3;
  if (pbVar3 != (rxcmd->stringData).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,pbVar3
              );
    pbVar3 = (rxcmd->stringData).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = (rxcmd->stringData).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((ulong)((long)pbVar3 - (long)pbVar4) < 0x21) {
    CLI::std::__cxx11::to_string(&bStack_108,iVar2);
    std::operator+(&local_e8,"--external --localport=",&bStack_108);
    pbVar3 = &local_e8;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_c0,pbVar3);
  }
  else {
    std::operator+(&bStack_108,pbVar4 + 1," --external --localport=");
    CLI::std::__cxx11::to_string(&local_48,iVar2);
    std::operator+(&local_e8,&bStack_108,&local_48);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_c0,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    pbVar3 = &local_48;
  }
  std::__cxx11::string::~string((string *)pbVar3);
  std::__cxx11::string::~string((string *)&bStack_108);
  local_e8._M_dataplus._M_p = (pointer)0x0;
  local_e8._M_string_length = 0;
  if ((char *)local_88.first._M_string_length == (char *)0x0) {
    BrokerFactory::findJoinableBrokerOfType((CoreType)&bStack_108);
    CLI::std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&local_e8,
               (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&bStack_108);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_108._M_string_length);
    if ((long *)local_e8._M_dataplus._M_p != (long *)0x0) goto LAB_001f6b39;
    configureString_00._M_str = local_c0._M_dataplus._M_p;
    configureString_00._M_len = local_c0._M_string_length;
    BrokerFactory::create((BrokerFactory *)&bStack_108,ctype,configureString_00);
  }
  else {
    brokerName_00._M_str = (char *)local_88.first._M_string_length;
    brokerName_00._M_len = (size_t)&bStack_108;
    BrokerFactory::findBroker(brokerName_00);
    CLI::std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&local_e8,
               (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&bStack_108);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_108._M_string_length);
    if ((long *)local_e8._M_dataplus._M_p != (long *)0x0) {
LAB_001f6b39:
      cVar5 = '\0';
      goto LAB_001f6b78;
    }
    brokerName._M_len = (ulong)ctype;
    brokerName._M_str = (char *)local_88.first._M_string_length;
    configureString._M_str = (char *)local_c0._M_string_length;
    configureString._M_len = (size_t)local_88.first._M_dataplus._M_p;
    BrokerFactory::create((CoreType)&bStack_108,brokerName,configureString);
  }
  CLI::std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&local_e8,
             (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&bStack_108);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_108._M_string_length);
  cVar5 = '\x01';
  (**(code **)(*(long *)local_e8._M_dataplus._M_p + 0x10))();
LAB_001f6b78:
  std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,(__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&local_e8);
  local_90 = cVar5;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_88);
  if (local_90 == '\x01') {
    assignPort(pdata,iVar2,(shared_ptr<helics::Broker> *)&local_a0);
  }
  ActionMessage::ActionMessage(__return_storage_ptr__,cmd_protocol);
  __return_storage_ptr__->messageID = 0x14d;
  iVar2 = (*(local_a0._M_ptr)->_vptr_Broker[0xb])();
  name._M_str = *(char **)CONCAT44(extraout_var,iVar2);
  name._M_len = ((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
  ActionMessage::name(__return_storage_ptr__,name);
  iVar2 = (*(local_a0._M_ptr)->_vptr_Broker[0xc])();
  gmlc::networking::extractInterfaceAndPortString
            (&local_88,(string *)CONCAT44(extraout_var_00,iVar2));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"?:",(allocator<char> *)&bStack_108);
  std::operator+(&local_c0,&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_88.second);
  str._M_str = local_c0._M_dataplus._M_p;
  str._M_len = local_c0._M_string_length;
  ActionMessage::setString(__return_storage_ptr__,0,str);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e8);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

ActionMessage TypedBrokerServer::generateMessageResponse(const ActionMessage& rxcmd,
                                                         portData& pdata,
                                                         CoreType ctype)
{
    //   std::cout << "received data length " << msg.size () << std::endl;
    switch (rxcmd.action()) {
        case CMD_PROTOCOL:
        case CMD_PROTOCOL_PRIORITY:
        case CMD_PROTOCOL_BIG:
            switch (rxcmd.messageID) {
                case REQUEST_PORTS:
                case CONNECTION_INFORMATION: {
                    auto pt = getOpenPort(pdata);
                    if (pt > 0) {
                        auto nbrk = findBroker(rxcmd, ctype, pt);
                        if (nbrk.second) {
                            assignPort(pdata, pt, nbrk.first);
                        }
                        return generatePortRequestReply(rxcmd, nbrk.first);
                    }
                    ActionMessage rep(CMD_PROTOCOL);
                    rep.messageID = DELAY_CONNECTION;
                    return rep;
                } break;
            }
            break;
        default:
            // std::cout << "received unknown message " << msg.size() << std::endl;
            // repSocket.send("ignored");
            break;
    }
    return CMD_IGNORE;
}